

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseIncoming.cpp
# Opt level: O0

Result __thiscall
tonk::SessionIncoming::onCompressed(SessionIncoming *this,uint8_t *data,uint bytes)

{
  char *pcVar1;
  int in_ECX;
  undefined8 in_RDX;
  ulong uVar2;
  uint8_t *in_RSI;
  ErrorResult *in_RDI;
  bool bVar3;
  uint8_t *messageData;
  uint messageBytes;
  uint messageType;
  ReadByteStream frameReader;
  Result decompressResult;
  Decompressed decompressed;
  Result *deliveryResult;
  uint16_t value;
  uint8_t *data_1;
  Result *in_stack_fffffffffffffdc0;
  ErrorType in_stack_fffffffffffffdcc;
  string *in_stack_fffffffffffffdd0;
  ErrorResult *desc;
  char *in_stack_fffffffffffffdd8;
  ErrorResult *in_stack_fffffffffffffde0;
  ErrorResult *pEVar4;
  allocator<char> local_1b1;
  string local_1b0 [8];
  Decompressed *in_stack_fffffffffffffe58;
  uint in_stack_fffffffffffffe64;
  void *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  undefined1 uVar5;
  allocator local_179;
  string local_178 [32];
  uint local_158;
  uint local_154;
  ReadByteStream local_150;
  uint local_140;
  char *local_130;
  uint8_t *local_128;
  uint local_120;
  SessionIncoming *in_stack_ffffffffffffff08;
  
  if (in_ECX == 0) {
    Result::Success();
  }
  else {
    pEVar4 = in_RDI;
    MessageDecompressor::Decompress
              ((MessageDecompressor *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,in_stack_fffffffffffffe58);
    if (local_130 == (char *)0x0) {
      siamese::ReadByteStream::ReadByteStream(&local_150,local_128,(ulong)local_120);
      do {
        if (local_150.BufferBytes - local_150.BytesRead < 2) {
          if (local_150.BufferBytes == local_150.BytesRead) {
            Result::Success();
            local_140 = 1;
          }
          else {
            pEVar4 = (ErrorResult *)&local_1b1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1b0,"Invalid frame",(allocator *)pEVar4);
            desc = in_RDI;
            pcVar1 = (char *)operator_new(0x38);
            ErrorResult::ErrorResult
                      (pEVar4,pcVar1,(string *)desc,in_stack_fffffffffffffdcc,
                       (ErrorCodeT)in_stack_fffffffffffffdc0);
            desc->Source = pcVar1;
            std::__cxx11::string::~string(local_1b0);
            std::allocator<char>::~allocator(&local_1b1);
            local_140 = 1;
          }
          break;
        }
        uVar2 = (ulong)local_150.BytesRead;
        local_150.BytesRead = local_150.BytesRead + 2;
        local_154 = (uint)*(ushort *)(local_150.Data + uVar2);
        local_158 = local_154 & 0x7ff;
        if (local_150.BufferBytes - local_150.BytesRead < local_158) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_178,"Truncated message",&local_179);
          pcVar1 = (char *)operator_new(0x38);
          ErrorResult::ErrorResult
                    (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                     in_stack_fffffffffffffdcc,(ErrorCodeT)in_stack_fffffffffffffdc0);
          in_RDI->Source = pcVar1;
          std::__cxx11::string::~string(local_178);
          std::allocator<char>::~allocator((allocator<char> *)&local_179);
          local_140 = 1;
          break;
        }
        local_154 = (uint)(*(ushort *)(local_150.Data + uVar2) >> 0xb);
        local_150.BytesRead = local_158 + local_150.BytesRead;
        uVar5 = Tonk;
        deliverMessage(in_stack_ffffffffffffff08,(uint)((ulong)pEVar4 >> 0x20),in_RSI,
                       (uint)((ulong)in_RDX >> 0x20));
        bVar3 = in_RDI->Source != (char *)0x0;
        if (bVar3) {
          uVar5 = Siamese;
        }
        local_140 = (uint)bVar3;
        if ((uVar5 & Siamese) == Tonk) {
          Result::~Result(in_stack_fffffffffffffdc0);
        }
      } while (local_140 == 0);
    }
    else {
      in_RDI->Source = local_130;
      local_130 = (char *)0x0;
      local_140 = 1;
    }
    Result::~Result(in_stack_fffffffffffffdc0);
  }
  return (Result)in_RDI;
}

Assistant:

Result SessionIncoming::onCompressed(
    const uint8_t* data,
    unsigned bytes)
{
    if (bytes <= 0) {
        return Result::Success();
    }

    Decompressed decompressed;
    Result decompressResult = Decompressor.Decompress(
        data,
        bytes,
        decompressed);
    if (decompressResult.IsFail()) {
        return decompressResult;
    }

    siamese::ReadByteStream frameReader(decompressed.Data, decompressed.Bytes);

    // Process all messages contained in the compressed payload:
    while (frameReader.Remaining() >= protocol::kMessageFrameBytes)
    {
        // Read message frame header
        unsigned messageType = frameReader.Read16();
        const unsigned messageBytes = messageType & protocol::kMessageLengthMask;

        if (frameReader.Remaining() < messageBytes) {
            TONK_DEBUG_BREAK();
            return Result("SessionIncoming::decompress", "Truncated message", ErrorType::Tonk, Tonk_InvalidData);
        }

        messageType >>= protocol::kMessageLengthBits;
        const uint8_t* messageData = frameReader.Read(messageBytes);

        TONK_DEBUG_ASSERT(messageType >= protocol::MessageType_StartOfReliables);
        TONK_DEBUG_ASSERT(messageType != protocol::MessageType_Unordered);

        const Result deliveryResult = deliverMessage(messageType, messageData, messageBytes);
        if (deliveryResult.IsFail()) {
            return deliveryResult;
        }
    }

    // If the message payload was not completely used:
    if (frameReader.Remaining() > 0) {
        TONK_DEBUG_BREAK(); // Invalid data
        return Result("SessionIncoming::decompress", "Invalid frame", ErrorType::Tonk, Tonk_InvalidData);
    }

    return Result::Success();
}